

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
 mp::internal::ExprBase::
 Create<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
           (Impl *impl)

{
  bool bVar1;
  Kind k;
  char *message;
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> in_RDI;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
  expr;
  AssertionFailure *in_stack_ffffffffffffffe0;
  
  if (in_RDI.super_ExprBase.impl_ != (Impl *)0x0) {
    k = Impl::kind((Impl *)in_RDI.super_ExprBase.impl_);
    bVar1 = Is<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
                      (k);
    if (!bVar1) {
      message = (char *)__cxa_allocate_exception(0x10);
      AssertionFailure::AssertionFailure(in_stack_ffffffffffffffe0,message);
      __cxa_throw(message,&AssertionFailure::typeinfo,AssertionFailure::~AssertionFailure);
    }
  }
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
  ::BasicBinaryExpr((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
                     *)0x15f4d2);
  return (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
          )(Impl *)in_RDI.super_ExprBase.impl_;
}

Assistant:

static TargetExpr Create(const ExprBase::Impl *impl) {
    MP_ASSERT((!impl || internal::Is<TargetExpr>(impl->kind())),
              "invalid expression kind");
    TargetExpr expr;
    expr.impl_ = impl;
    return expr;
  }